

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cpp
# Opt level: O2

void PrintExceptionContinue(exception *pex,string_view thread_name)

{
  long lVar1;
  basic_string_view<char,_std::char_traits<char>_> *args_3;
  basic_string_view<char,_std::char_traits<char>_> *in_R8;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  char *local_50;
  char *pszModule;
  char *local_40;
  char *local_38;
  string message;
  
  local_38 = thread_name._M_str;
  local_40 = (char *)thread_name._M_len;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pszModule = "bitcoin";
  if (pex == (exception *)0x0) {
    tinyformat::format<char_const*,std::basic_string_view<char,std::char_traits<char>>>
              (&message,(tinyformat *)"UNKNOWN EXCEPTION       \n%s in %s       \n",
               (char *)&pszModule,&local_40,in_R8);
  }
  else {
    local_50 = *(char **)(*(long *)(*(long *)pex + -8) + 8);
    local_50 = local_50 + (*local_50 == '*');
    args_3 = (basic_string_view<char,_std::char_traits<char>_> *)
             (**(code **)(*(long *)pex + 0x10))();
    tinyformat::
    format<char_const*,char_const*,char_const*,std::basic_string_view<char,std::char_traits<char>>>
              (&message,(tinyformat *)"EXCEPTION: %s       \n%s       \n%s in %s       \n",
               (char *)&local_50,(char **)&stack0xffffffffffffffa8,&pszModule,&local_40,args_3);
  }
  logging_function._M_str = "PrintExceptionContinue";
  logging_function._M_len = 0x16;
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/util/exception.cpp"
  ;
  source_file._M_len = 0x62;
  LogPrintFormatInternal<std::__cxx11::string>
            (logging_function,source_file,0x27,ALL,Info,(ConstevalFormatString<1U>)0x428d6e,&message
            );
  tinyformat::format<std::__cxx11::string>
            ((ostream *)&std::cerr,"\n\n************************\n%s\n",&message);
  std::__cxx11::string::~string((string *)&message);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PrintExceptionContinue(const std::exception* pex, std::string_view thread_name)
{
    std::string message = FormatException(pex, thread_name);
    LogPrintf("\n\n************************\n%s\n", message);
    tfm::format(std::cerr, "\n\n************************\n%s\n", message);
}